

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O0

void blake2b_long(void *out,size_t outlen,void *in,size_t inlen)

{
  undefined8 local_158;
  uint8_t out_buffer [64];
  uint local_110;
  undefined1 local_10c [4];
  uint32_t toproduce;
  uint8_t outlen_bytes [4];
  blake2b_state blake_state;
  uint8_t *pout;
  size_t inlen_local;
  void *in_local;
  size_t outlen_local;
  void *out_local;
  
  memset(local_10c,0,4);
  local_110 = (uint)outlen;
  store32(local_10c,local_110);
  if (outlen < 0x41) {
    blake2b_init((blake2b_state *)&toproduce,outlen);
    blake2b_update((blake2b_state *)&toproduce,local_10c,4);
    blake2b_update((blake2b_state *)&toproduce,in,inlen);
    blake2b_final((blake2b_state *)&toproduce,out,outlen);
  }
  else {
    blake2b_init((blake2b_state *)&toproduce,0x40);
    blake2b_update((blake2b_state *)&toproduce,local_10c,4);
    blake2b_update((blake2b_state *)&toproduce,in,inlen);
    blake2b_final((blake2b_state *)&toproduce,&local_158,0x40);
    *(undefined8 *)out = local_158;
    *(undefined8 *)((long)out + 8) = out_buffer._0_8_;
    *(undefined8 *)((long)out + 0x10) = out_buffer._8_8_;
    *(undefined8 *)((long)out + 0x18) = out_buffer._16_8_;
    blake_state.buflen = (long)out + 0x20;
    while (local_110 = local_110 - 0x20, 0x40 < local_110) {
      blake2b_init((blake2b_state *)&toproduce,0x40);
      blake2b_update((blake2b_state *)&toproduce,&local_158,0x40);
      blake2b_final((blake2b_state *)&toproduce,&local_158,0x40);
      *(undefined8 *)blake_state.buflen = local_158;
      *(undefined8 *)(blake_state.buflen + 8) = out_buffer._0_8_;
      *(undefined8 *)(blake_state.buflen + 0x10) = out_buffer._8_8_;
      *(undefined8 *)(blake_state.buflen + 0x18) = out_buffer._16_8_;
      blake_state.buflen = blake_state.buflen + 0x20;
    }
    blake2b_init((blake2b_state *)&toproduce,(ulong)local_110);
    blake2b_update((blake2b_state *)&toproduce,&local_158,0x40);
    blake2b_final((blake2b_state *)&toproduce,&local_158,(ulong)local_110);
    memcpy((void *)blake_state.buflen,&local_158,(ulong)local_110);
    clear_internal_memory(&local_158,0x40);
  }
  return;
}

Assistant:

void blake2b_long(void *out, size_t outlen, const void *in, size_t inlen)
{
    uint8_t *pout = (uint8_t *)out;
    blake2b_state blake_state;
    uint8_t outlen_bytes[sizeof(uint32_t)] = {0};

    store32(outlen_bytes, (uint32_t)outlen);
    if (outlen <= BLAKE2B_OUTBYTES) {
        blake2b_init(&blake_state, outlen);
        blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes));
        blake2b_update(&blake_state, in, inlen);
        blake2b_final(&blake_state, pout, outlen);
    } else {
        uint32_t toproduce;
        uint8_t out_buffer[BLAKE2B_OUTBYTES];

        blake2b_init(&blake_state, BLAKE2B_OUTBYTES);
        blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes));
        blake2b_update(&blake_state, in, inlen);
        blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES);

        memcpy(pout, out_buffer, BLAKE2B_OUTBYTES / 2);
        pout += BLAKE2B_OUTBYTES / 2;
        toproduce = (uint32_t)outlen - BLAKE2B_OUTBYTES / 2;

        while (toproduce > BLAKE2B_OUTBYTES) {
            blake2b_init(&blake_state, BLAKE2B_OUTBYTES);
            blake2b_update(&blake_state, out_buffer, BLAKE2B_OUTBYTES);
            blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES);

            memcpy(pout, out_buffer, BLAKE2B_OUTBYTES / 2);
            pout += BLAKE2B_OUTBYTES / 2;
            toproduce -= BLAKE2B_OUTBYTES / 2;
        }

        blake2b_init(&blake_state, toproduce);
        blake2b_update(&blake_state, out_buffer, BLAKE2B_OUTBYTES);
        blake2b_final(&blake_state, out_buffer, toproduce);

        memcpy(pout, out_buffer, toproduce);

        clear_internal_memory(out_buffer, sizeof(out_buffer));
    }
}